

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrFlagsResult ValidateXrLocalizationMapErrorFlagsML(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 0x40) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrLocalizationMapErrorFlagsML(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_LOCALIZATION_MAP_ERROR_UNKNOWN_BIT_ML) != 0) {
        // Clear the value XR_LOCALIZATION_MAP_ERROR_UNKNOWN_BIT_ML since it is valid
        int_value &= ~XR_LOCALIZATION_MAP_ERROR_UNKNOWN_BIT_ML;
    }
    if ((int_value & XR_LOCALIZATION_MAP_ERROR_OUT_OF_MAPPED_AREA_BIT_ML) != 0) {
        // Clear the value XR_LOCALIZATION_MAP_ERROR_OUT_OF_MAPPED_AREA_BIT_ML since it is valid
        int_value &= ~XR_LOCALIZATION_MAP_ERROR_OUT_OF_MAPPED_AREA_BIT_ML;
    }
    if ((int_value & XR_LOCALIZATION_MAP_ERROR_LOW_FEATURE_COUNT_BIT_ML) != 0) {
        // Clear the value XR_LOCALIZATION_MAP_ERROR_LOW_FEATURE_COUNT_BIT_ML since it is valid
        int_value &= ~XR_LOCALIZATION_MAP_ERROR_LOW_FEATURE_COUNT_BIT_ML;
    }
    if ((int_value & XR_LOCALIZATION_MAP_ERROR_EXCESSIVE_MOTION_BIT_ML) != 0) {
        // Clear the value XR_LOCALIZATION_MAP_ERROR_EXCESSIVE_MOTION_BIT_ML since it is valid
        int_value &= ~XR_LOCALIZATION_MAP_ERROR_EXCESSIVE_MOTION_BIT_ML;
    }
    if ((int_value & XR_LOCALIZATION_MAP_ERROR_LOW_LIGHT_BIT_ML) != 0) {
        // Clear the value XR_LOCALIZATION_MAP_ERROR_LOW_LIGHT_BIT_ML since it is valid
        int_value &= ~XR_LOCALIZATION_MAP_ERROR_LOW_LIGHT_BIT_ML;
    }
    if ((int_value & XR_LOCALIZATION_MAP_ERROR_HEADPOSE_BIT_ML) != 0) {
        // Clear the value XR_LOCALIZATION_MAP_ERROR_HEADPOSE_BIT_ML since it is valid
        int_value &= ~XR_LOCALIZATION_MAP_ERROR_HEADPOSE_BIT_ML;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}